

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O0

bool __thiscall DHUDMessageFadeInOut::Tick(DHUDMessageFadeInOut *this)

{
  bool bVar1;
  DHUDMessageFadeInOut *this_local;
  
  bVar1 = DHUDMessageFadeOut::Tick(&this->super_DHUDMessageFadeOut);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    if (((this->super_DHUDMessageFadeOut).super_DHUDMessage.State == 0) &&
       (*(int *)&(this->super_DHUDMessageFadeOut).field_0xc4 <=
        (this->super_DHUDMessageFadeOut).super_DHUDMessage.Tics)) {
      (this->super_DHUDMessageFadeOut).super_DHUDMessage.State =
           (this->super_DHUDMessageFadeOut).super_DHUDMessage.State + 1;
      (this->super_DHUDMessageFadeOut).super_DHUDMessage.Tics =
           (this->super_DHUDMessageFadeOut).super_DHUDMessage.Tics -
           *(int *)&(this->super_DHUDMessageFadeOut).field_0xc4;
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DHUDMessageFadeInOut::Tick ()
{
	if (!Super::Tick ())
	{
		if (State == 0 && FadeInTics <= Tics)
		{
			State++;
			Tics -= FadeInTics;
		}
		return false;
	}
	return true;
}